

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::PackageSymbol::findForImport(PackageSymbol *this,string_view lookupName)

{
  char *pcVar1;
  group_type_pointer pgVar2;
  SymbolKind SVar3;
  long lVar4;
  WildcardImportData *pWVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  ulong uVar8;
  ExplicitImportSymbol *this_00;
  pointer ppPVar9;
  size_t sVar10;
  uint uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  bool bVar16;
  byte bVar17;
  uint uVar18;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  uint64_t uVar19;
  Symbol *pSVar20;
  value_type_pointer __y;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  basic_string_view<char,_std::char_traits<char>_> *pbVar24;
  Symbol *pSVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view sVar28;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  byte bStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  byte bStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  byte bStack_39;
  
  local_78._M_str = lookupName._M_str;
  local_78._M_len = lookupName._M_len;
  this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
            Scope::getNameMap(&this->super_Scope);
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_01,&local_78);
  uVar22 = uVar19 >> ((byte)*this_01 & 0x3f);
  lVar23 = (uVar19 & 0xff) * 4;
  cVar12 = (&UNK_007e24cc)[lVar23];
  cVar13 = (&UNK_007e24cd)[lVar23];
  cVar14 = (&UNK_007e24ce)[lVar23];
  bVar15 = (&UNK_007e24cf)[lVar23];
  uVar21 = 0;
  do {
    lVar23 = *(long *)(this_01 + 0x10);
    pcVar1 = (char *)(lVar23 + uVar22 * 0x10);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    bStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    bStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    bStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    bVar17 = pcVar1[0xf];
    auVar26[0] = -(local_48 == cVar12);
    auVar26[1] = -(cStack_47 == cVar13);
    auVar26[2] = -(cStack_46 == cVar14);
    auVar26[3] = -(bStack_45 == bVar15);
    auVar26[4] = -(cStack_44 == cVar12);
    auVar26[5] = -(cStack_43 == cVar13);
    auVar26[6] = -(cStack_42 == cVar14);
    auVar26[7] = -(bStack_41 == bVar15);
    auVar26[8] = -(cStack_40 == cVar12);
    auVar26[9] = -(cStack_3f == cVar13);
    auVar26[10] = -(cStack_3e == cVar14);
    auVar26[0xb] = -(bStack_3d == bVar15);
    auVar26[0xc] = -(cStack_3c == cVar12);
    auVar26[0xd] = -(cStack_3b == cVar13);
    auVar26[0xe] = -(cStack_3a == cVar14);
    auVar26[0xf] = -(bVar17 == bVar15);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar17;
    if (uVar18 != 0) {
      lVar4 = *(long *)(this_01 + 0x18);
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        pbVar24 = (basic_string_view<char,_std::char_traits<char>_> *)
                  ((ulong)uVar11 * 0x18 + lVar4 + uVar22 * 0x168);
        bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_01,&local_78,pbVar24);
        if (bVar16) {
          pbVar24 = pbVar24 + 1;
          while( true ) {
            this_00 = (ExplicitImportSymbol *)pbVar24->_M_len;
            SVar3 = (this_00->super_Symbol).kind;
            if (SVar3 != TransparentMember) break;
            pbVar24 = &this_00->packageName;
          }
          if (SVar3 == ForwardingTypedef) {
            return (Symbol *)0x0;
          }
          if (SVar3 == ExplicitImport) {
            pSVar20 = ExplicitImportSymbol::importedSymbol(this_00);
            return pSVar20;
          }
          return &this_00->super_Symbol;
        }
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
      bVar17 = *(byte *)(lVar23 + uVar22 * 0x10 + 0xf);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bVar17) == 0) break;
    lVar23 = uVar22 + uVar21;
    uVar21 = uVar21 + 1;
    uVar22 = lVar23 + 1U & *(ulong *)(this_01 + 8);
  } while (uVar21 <= *(ulong *)(this_01 + 8));
  pWVar5 = (this->super_Scope).importData;
  if ((pWVar5 == (WildcardImportData *)0x0) ||
     ((this->hasExportAll == false && ((this->exportDecls)._M_extent._M_extent_value == 0)))) {
    return (Symbol *)0x0;
  }
  if (pWVar5->hasForceElaborated == false) {
    pWVar5->hasForceElaborated = true;
    Compilation::forceElaborate((this->super_Scope).compilation,&this->super_Symbol);
  }
  uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &pWVar5->importedSymbols,&local_78);
  uVar21 = uVar19 >> ((byte)(pWVar5->importedSymbols).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar23 = (uVar19 & 0xff) * 4;
  local_68 = (&UNK_007e24cc)[lVar23];
  uStack_67 = (&UNK_007e24cd)[lVar23];
  uStack_66 = (&UNK_007e24ce)[lVar23];
  bStack_65 = (&UNK_007e24cf)[lVar23];
  uVar22 = 0;
  uStack_64 = local_68;
  uStack_63 = uStack_67;
  uStack_62 = uStack_66;
  bStack_61 = bStack_65;
  uStack_60 = local_68;
  uStack_5f = uStack_67;
  uStack_5e = uStack_66;
  bStack_5d = bStack_65;
  uStack_5c = local_68;
  uStack_5b = uStack_67;
  uStack_5a = uStack_66;
  bStack_59 = bStack_65;
  do {
    pgVar6 = (pWVar5->importedSymbols).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
             .arrays.groups_;
    pgVar2 = pgVar6 + uVar21;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    auVar27[0] = -(local_58 == local_68);
    auVar27[1] = -(uStack_57 == uStack_67);
    auVar27[2] = -(uStack_56 == uStack_66);
    auVar27[3] = -(bStack_55 == bStack_65);
    auVar27[4] = -(uStack_54 == uStack_64);
    auVar27[5] = -(uStack_53 == uStack_63);
    auVar27[6] = -(uStack_52 == uStack_62);
    auVar27[7] = -(bStack_51 == bStack_61);
    auVar27[8] = -(uStack_50 == uStack_60);
    auVar27[9] = -(uStack_4f == uStack_5f);
    auVar27[10] = -(uStack_4e == uStack_5e);
    auVar27[0xb] = -(bStack_4d == bStack_5d);
    auVar27[0xc] = -(uStack_4c == uStack_5c);
    auVar27[0xd] = -(uStack_4b == uStack_5b);
    auVar27[0xe] = -(uStack_4a == uStack_5a);
    auVar27[0xf] = -(bStack_49 == bStack_59);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar7 = (pWVar5->importedSymbols).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
               .arrays.elements_;
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        __y = ppVar7 + uVar21 * 0xf + (ulong)uVar11;
        bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &pWVar5->importedSymbols,&local_78,&__y->first);
        if (bVar16) {
          pSVar20 = __y->second;
          pSVar25 = pSVar20;
          if (this->hasExportAll != false) {
            return pSVar20;
          }
          do {
            pSVar25 = pSVar25->parentScope->thisSym;
          } while (pSVar25->kind != Package);
          ppPVar9 = (this->exportDecls)._M_ptr;
          sVar10 = (this->exportDecls)._M_extent._M_extent_value;
          lVar23 = 0;
          do {
            if (sVar10 << 3 == lVar23) {
              return (Symbol *)0x0;
            }
            lVar4 = *(long *)((long)ppPVar9 + lVar23);
            sVar28 = parsing::Token::valueText((Token *)(lVar4 + 0x18));
            bVar16 = std::operator==(sVar28,pSVar25->name);
            if (bVar16) {
              if (*(short *)(lVar4 + 0x38) == 0x1b) {
                return pSVar20;
              }
              sVar28 = parsing::Token::valueText((Token *)(lVar4 + 0x38));
              bVar16 = std::operator==(sVar28,pSVar20->name);
              if (bVar16) {
                return pSVar20;
              }
            }
            lVar23 = lVar23 + 8;
          } while( true );
        }
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
      bStack_49 = pgVar6[uVar21].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7] & bStack_49) == 0) {
      return (Symbol *)0x0;
    }
    uVar8 = (pWVar5->importedSymbols).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
            .arrays.groups_size_mask;
    lVar23 = uVar21 + uVar22;
    uVar22 = uVar22 + 1;
    uVar21 = lVar23 + 1U & uVar8;
  } while (uVar22 <= uVar8);
  return (Symbol *)0x0;
}

Assistant:

const Symbol* PackageSymbol::findForImport(std::string_view lookupName) const {
    auto& scopeNameMap = getNameMap();
    if (auto it = scopeNameMap.find(lookupName); it != scopeNameMap.end()) {
        auto symbol = it->second;
        while (symbol->kind == SymbolKind::TransparentMember)
            symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

        switch (symbol->kind) {
            case SymbolKind::ExplicitImport:
                return symbol->as<ExplicitImportSymbol>().importedSymbol();
            case SymbolKind::ForwardingTypedef:
                return nullptr;
            default:
                return symbol;
        }
    }

    auto wildcardData = getWildcardImportData();
    if (!wildcardData || (!hasExportAll && exportDecls.empty()))
        return nullptr;

    // We need to force-elaborate the entire package body because any
    // lookups that result in a wildcard import could add to our export list.
    if (!wildcardData->hasForceElaborated) {
        wildcardData->hasForceElaborated = true;
        getCompilation().forceElaborate(*this);
    }

    // Look through symbols that have been wildcard imported with this name.
    if (auto it = wildcardData->importedSymbols.find(lookupName);
        it != wildcardData->importedSymbols.end()) {

        auto symbol = it->second;
        if (hasExportAll)
            return symbol;

        // If we don't have an export-all directive then we need to check
        // whether we wanted to actually export this symbol.
        // First find the package that owns the target symbol.
        const Symbol* packageParent;
        auto targetScope = symbol->getParentScope();
        while (true) {
            SLANG_ASSERT(targetScope);
            packageParent = &targetScope->asSymbol();
            if (packageParent->kind == SymbolKind::Package)
                break;

            targetScope = packageParent->getParentScope();
        }

        // Now look for a matching export.
        for (auto decl : exportDecls) {
            if (decl->package.valueText() != packageParent->name)
                continue;

            if (decl->item.kind == TokenKind::Star || decl->item.valueText() == symbol->name)
                return symbol;
        }
    }

    return nullptr;
}